

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O0

aspa_verification_result
aspa_verify_as_path_upstream(aspa_table *aspa_table,uint32_t *as_path,size_t len)

{
  long lVar1;
  aspa_hop_result aVar2;
  long in_FS_OFFSET;
  bool bVar3;
  size_t c;
  size_t rr;
  _Bool found_nP_from_right;
  size_t sStack_38;
  aspa_hop_result last_hop_right;
  size_t r;
  size_t len_local;
  uint32_t *as_path_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    lrtr_dbg("ASPA: TRYING TO VALIDATE A AS_PATH BUT NO ASPA TABLE INITIALIZED");
    aspa_table_local._4_4_ = ASPA_AS_PATH_INVALID;
  }
  else if (len < 2) {
    aspa_table_local._4_4_ = ASPA_AS_PATH_VALID;
  }
  else {
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    sStack_38 = len - 1;
    while( true ) {
      bVar3 = false;
      if (sStack_38 != 0) {
        rr._4_4_ = aspa_check_hop(aspa_table,as_path[sStack_38],as_path[sStack_38 - 1]);
        bVar3 = rr._4_4_ == ASPA_PROVIDER_PLUS;
      }
      if (!bVar3) break;
      sStack_38 = sStack_38 - 1;
    }
    if (sStack_38 == 0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      aspa_table_local._4_4_ = ASPA_AS_PATH_VALID;
    }
    else {
      bVar3 = false;
      c = sStack_38;
      if (rr._4_4_ == ASPA_NOT_PROVIDER_PLUS) {
        bVar3 = true;
      }
      else {
        do {
          if (c == 0) goto LAB_00114b0b;
          aVar2 = aspa_check_hop(aspa_table,as_path[c],as_path[c - 1]);
          c = c - 1;
        } while (aVar2 != ASPA_NOT_PROVIDER_PLUS);
        bVar3 = true;
      }
LAB_00114b0b:
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      if (bVar3) {
        aspa_table_local._4_4_ = ASPA_AS_PATH_INVALID;
      }
      else {
        aspa_table_local._4_4_ = ASPA_AS_PATH_UNKNOWN;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return aspa_table_local._4_4_;
}

Assistant:

static enum aspa_verification_result aspa_verify_as_path_upstream(struct aspa_table *aspa_table, uint32_t as_path[],
								  size_t len)
{
	if (aspa_table == NULL) {
		ASPA_DBG1("TRYING TO VALIDATE A AS_PATH BUT NO ASPA TABLE INITIALIZED");
		return ASPA_AS_PATH_INVALID;
	}

	// Optimized AS_PATH verification algorithm using zero based array
	// where the origin AS has index N - 1 and the latest AS in the AS_PATH
	// has index 0.
	// Doesn't check any hop twice.
	if (len <= 1)
		// Trivially VALID AS_PATH
		return ASPA_AS_PATH_VALID;

	pthread_rwlock_rdlock(&aspa_table->lock);

	// Find apex of up-ramp
	size_t r = len - 1;
	enum aspa_hop_result last_hop_right;

	while (r > 0 && (last_hop_right = aspa_check_hop(aspa_table, as_path[r], as_path[r - 1])) == ASPA_PROVIDER_PLUS)
		r -= 1;

	if (r == 0) {
		// Complete customer-provider chain, VALID upstream AS_PATH
		pthread_rwlock_unlock(&aspa_table->lock);
		return ASPA_AS_PATH_VALID;
	}

	bool found_nP_from_right = false;

	/*
	 * Look for nP+ in the right-to-left/upwards direction
	 * Check if there's a nP+ hop in the gap from the right (facing left/up).
	 * a, The next hop right after the up-ramp was already retrieved from the database,
	 *    so just check if that hop was nP+.
	 * b, Also, don't check last hop before down-ramp starts
	 *    because there must be a hop of space in order for two
	 *    nP+ hops to oppose each other.
	 * c, RR points to the left end of the hop last checked.
	 * d, Checking stops if the hop is nP+.
	 *
	 *        Last chance of finding a relevant nP+ hop
	 *           /
	 *   L      /\                  R
	 *   * -- * -- * . . . . . * -- *
	 *   0   L+1              R-1    \
	 *         |<------------------|  *
	 *                               N-1
	 *
	 */

	size_t rr = r;

	if (last_hop_right == ASPA_NOT_PROVIDER_PLUS) {
		found_nP_from_right = true;
	} else {
		while (rr > 0) {
			size_t c = rr;

			rr--;
			if (aspa_check_hop(aspa_table, as_path[c], as_path[rr]) == ASPA_NOT_PROVIDER_PLUS) {
				found_nP_from_right = true;
				break;
			}
		}
	}

	pthread_rwlock_unlock(&aspa_table->lock);

	// If nP+ occurs upstream customer-provider chain, return INVALID.
	if (found_nP_from_right) {
		return ASPA_AS_PATH_INVALID;
	}

	return ASPA_AS_PATH_UNKNOWN;
}